

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

BIP155Network __thiscall CNetAddr::GetBIP155Network(CNetAddr *this)

{
  BIP155Network BVar1;
  long in_FS_OFFSET;
  
  BVar1 = IPV4;
  switch(this->m_net) {
  case NET_UNROUTABLE:
  case NET_INTERNAL:
  case NET_MAX:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                  ,0x2a,"CNetAddr::BIP155Network CNetAddr::GetBIP155Network() const");
  case NET_IPV4:
    break;
  case NET_IPV6:
    BVar1 = IPV6;
    break;
  case NET_ONION:
    BVar1 = TORV3;
    break;
  case NET_I2P:
    BVar1 = I2P;
    break;
  case NET_CJDNS:
    BVar1 = CJDNS;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                  ,0x2d,"CNetAddr::BIP155Network CNetAddr::GetBIP155Network() const");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return BVar1;
}

Assistant:

CNetAddr::BIP155Network CNetAddr::GetBIP155Network() const
{
    switch (m_net) {
    case NET_IPV4:
        return BIP155Network::IPV4;
    case NET_IPV6:
        return BIP155Network::IPV6;
    case NET_ONION:
        return BIP155Network::TORV3;
    case NET_I2P:
        return BIP155Network::I2P;
    case NET_CJDNS:
        return BIP155Network::CJDNS;
    case NET_INTERNAL:   // should have been handled before calling this function
    case NET_UNROUTABLE: // m_net is never and should not be set to NET_UNROUTABLE
    case NET_MAX:        // m_net is never and should not be set to NET_MAX
        assert(false);
    } // no default case, so the compiler can warn about missing cases

    assert(false);
}